

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hittable.h
# Opt level: O2

void __thiscall translate::translate(translate *this,shared_ptr<hittable> *object,vec3 *offset)

{
  double dVar1;
  aabb local_78;
  aabb local_48;
  
  (this->super_hittable)._vptr_hittable = (_func_int **)&PTR__translate_00125c38;
  std::__shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->object).super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>,
             &object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>);
  (this->offset).e[2] = offset->e[2];
  dVar1 = offset->e[1];
  (this->offset).e[0] = offset->e[0];
  (this->offset).e[1] = dVar1;
  *(undefined4 *)&(this->bbox).x.min = 0;
  *(undefined4 *)((long)&(this->bbox).x.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).x.max = 0;
  *(undefined4 *)((long)&(this->bbox).x.max + 4) = 0xfff00000;
  *(undefined4 *)&(this->bbox).y.min = 0;
  *(undefined4 *)((long)&(this->bbox).y.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).y.max = 0;
  *(undefined4 *)((long)&(this->bbox).y.max + 4) = 0xfff00000;
  *(undefined4 *)&(this->bbox).z.min = 0;
  *(undefined4 *)((long)&(this->bbox).z.min + 4) = 0x7ff00000;
  *(undefined4 *)&(this->bbox).z.max = 0;
  *(undefined4 *)((long)&(this->bbox).z.max + 4) = 0xfff00000;
  (*((object->super___shared_ptr<hittable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_hittable[3])
            (&local_48);
  operator+(&local_78,&local_48,offset);
  (this->bbox).z.min = local_78.z.min;
  (this->bbox).z.max = local_78.z.max;
  (this->bbox).y.min = local_78.y.min;
  (this->bbox).y.max = local_78.y.max;
  (this->bbox).x.min = local_78.x.min;
  (this->bbox).x.max = local_78.x.max;
  return;
}

Assistant:

translate(shared_ptr<hittable> object, const vec3& offset)
      : object(object), offset(offset)
    {
        bbox = object->bounding_box() + offset;
    }